

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.h
# Opt level: O2

void __thiscall
btQuantizedBvh::mergeInternalNodeAabb
          (btQuantizedBvh *this,int nodeIndex,btVector3 *newAabbMin,btVector3 *newAabbMax)

{
  btQuantizedBvhNode *pbVar1;
  int i;
  long lVar2;
  unsigned_short quantizedAabbMax [3];
  unsigned_short quantizedAabbMin [3];
  
  if (this->m_useQuantization == true) {
    quantize(this,quantizedAabbMin,newAabbMin,0);
    quantize(this,quantizedAabbMax,newAabbMax,1);
    pbVar1 = (this->m_quantizedContiguousNodes).m_data;
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      if (quantizedAabbMin[lVar2] < pbVar1[nodeIndex].m_quantizedAabbMin[lVar2]) {
        pbVar1[nodeIndex].m_quantizedAabbMin[lVar2] = quantizedAabbMin[lVar2];
      }
      if (pbVar1[nodeIndex].m_quantizedAabbMax[lVar2] < quantizedAabbMax[lVar2]) {
        pbVar1[nodeIndex].m_quantizedAabbMax[lVar2] = quantizedAabbMax[lVar2];
      }
    }
    return;
  }
  btVector3::setMin(&(this->m_contiguousNodes).m_data[nodeIndex].m_aabbMinOrg,newAabbMin);
  btVector3::setMax(&(this->m_contiguousNodes).m_data[nodeIndex].m_aabbMaxOrg,newAabbMax);
  return;
}

Assistant:

void mergeInternalNodeAabb(int nodeIndex,const btVector3& newAabbMin,const btVector3& newAabbMax) 
	{
		if (m_useQuantization)
		{
			unsigned short int quantizedAabbMin[3];
			unsigned short int quantizedAabbMax[3];
			quantize(quantizedAabbMin,newAabbMin,0);
			quantize(quantizedAabbMax,newAabbMax,1);
			for (int i=0;i<3;i++)
			{
				if (m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[i] > quantizedAabbMin[i])
					m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[i] = quantizedAabbMin[i];

				if (m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[i] < quantizedAabbMax[i])
					m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[i] = quantizedAabbMax[i];

			}
		} else
		{
			//non-quantized
			m_contiguousNodes[nodeIndex].m_aabbMinOrg.setMin(newAabbMin);
			m_contiguousNodes[nodeIndex].m_aabbMaxOrg.setMax(newAabbMax);		
		}
	}